

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QString.cpp
# Opt level: O1

bool __thiscall QToken::operator==(QToken *this,QToken *other)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  __s1 = (this->opts_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (this->opts_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar1 - (long)__s1;
  __s2 = (other->opts_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (__n != (long)(other->opts_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
    return false;
  }
  if (puVar1 != __s1) {
    iVar2 = bcmp(__s1,__s2,__n);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

bool QToken::operator==(const QToken &other) const {
    return opts_ == other.opts_;
}